

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmainct.c
# Opt level: O0

void process_data_simple_main
               (j_decompress_ptr cinfo,JSAMPARRAY output_buf,JDIMENSION *out_row_ctr,
               JDIMENSION out_rows_avail)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  JDIMENSION rowgroups_avail;
  my_main_ptr_conflict main_ptr;
  
  lVar2 = *(long *)(in_RDI + 0x228);
  if (*(int *)(lVar2 + 0x60) == 0) {
    iVar3 = (**(code **)(*(long *)(in_RDI + 0x230) + 0x18))(in_RDI,lVar2 + 0x10);
    if (iVar3 == 0) {
      return;
    }
    *(undefined4 *)(lVar2 + 0x60) = 1;
  }
  uVar1 = *(uint *)(in_RDI + 0x1a0);
  (**(code **)(*(long *)(in_RDI + 0x238) + 8))
            (in_RDI,lVar2 + 0x10,lVar2 + 100,uVar1,in_RSI,in_RDX,in_ECX);
  if (uVar1 <= *(uint *)(lVar2 + 100)) {
    *(undefined4 *)(lVar2 + 0x60) = 0;
    *(undefined4 *)(lVar2 + 100) = 0;
  }
  return;
}

Assistant:

METHODDEF(void)
process_data_simple_main(j_compress_ptr cinfo, JSAMPARRAY input_buf,
                         JDIMENSION *in_row_ctr, JDIMENSION in_rows_avail)
{
  my_main_ptr main_ptr = (my_main_ptr)cinfo->main;

  while (main_ptr->cur_iMCU_row < cinfo->total_iMCU_rows) {
    /* Read input data if we haven't filled the main buffer yet */
    if (main_ptr->rowgroup_ctr < DCTSIZE)
      (*cinfo->prep->pre_process_data) (cinfo, input_buf, in_row_ctr,
                                        in_rows_avail, main_ptr->buffer,
                                        &main_ptr->rowgroup_ctr,
                                        (JDIMENSION)DCTSIZE);

    /* If we don't have a full iMCU row buffered, return to application for
     * more data.  Note that preprocessor will always pad to fill the iMCU row
     * at the bottom of the image.
     */
    if (main_ptr->rowgroup_ctr != DCTSIZE)
      return;

    /* Send the completed row to the compressor */
    if (!(*cinfo->coef->compress_data) (cinfo, main_ptr->buffer)) {
      /* If compressor did not consume the whole row, then we must need to
       * suspend processing and return to the application.  In this situation
       * we pretend we didn't yet consume the last input row; otherwise, if
       * it happened to be the last row of the image, the application would
       * think we were done.
       */
      if (!main_ptr->suspended) {
        (*in_row_ctr)--;
        main_ptr->suspended = TRUE;
      }
      return;
    }
    /* We did finish the row.  Undo our little suspension hack if a previous
     * call suspended; then mark the main buffer empty.
     */
    if (main_ptr->suspended) {
      (*in_row_ctr)++;
      main_ptr->suspended = FALSE;
    }
    main_ptr->rowgroup_ctr = 0;
    main_ptr->cur_iMCU_row++;
  }
}